

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
          (QMovableArrayOps<QSize> *this,qsizetype i,QSize *args)

{
  QSize **ppQVar1;
  Data *pDVar2;
  QSize *pQVar3;
  QSize QVar4;
  qsizetype *pqVar5;
  bool bVar6;
  
  pDVar2 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00105540:
    QVar4 = *args;
    bVar6 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size != 0;
    QArrayDataPointer<QSize>::detachAndGrow
              ((QArrayDataPointer<QSize> *)this,(uint)(i == 0 && bVar6),1,(QSize **)0x0,
               (QArrayDataPointer<QSize> *)0x0);
    pQVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
    if (i != 0 || !bVar6) {
      memmove(pQVar3 + i + 1,pQVar3 + i,
              ((this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size - i) * 8);
      pQVar3[i] = QVar4;
      goto LAB_001055a5;
    }
    pQVar3[-1] = QVar4;
  }
  else {
    if (((this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size == i) &&
       (pQVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)pQVar3 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      pQVar3[i] = *args;
      goto LAB_001055a5;
    }
    if ((i != 0) ||
       (pQVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr,
       (QSize *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pQVar3)) goto LAB_00105540;
    pQVar3[-1] = *args;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_001055a5:
  pqVar5 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
  *pqVar5 = *pqVar5 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }